

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::InlineCallTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *callFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isCallInstanceFunction)

{
  code *pcVar1;
  FunctionJITTimeInfo *pFVar2;
  bool bVar3;
  bool bVar4;
  OpndKind OVar5;
  BuiltinFunction builtInId;
  uint localFuncId;
  Instr *pIVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  RegOpnd *this_00;
  StackSym *pSVar9;
  FunctionJITTimeInfo *inlineeData_00;
  Instr *local_a8;
  Instr *callLdInstr;
  Instr *callTargetLdInstr;
  FunctionJITTimeInfo *inlineeData;
  Instr *callbackDefInstr;
  Instr *local_80;
  StackSym *local_78;
  Instr *local_70;
  ulong local_68;
  StackSym *local_60;
  InlineCacheIndex local_54;
  Instr *pIStack_50;
  InlineCacheIndex inlineCacheIndex;
  Instr *local_48;
  Instr *explicitThisArgOut;
  CallApplyTargetSourceType local_34;
  byte local_33;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  CallApplyTargetSourceType targetType;
  bool safeThis;
  
  local_a8 = (Instr *)0x0;
  callLdInstr = (Instr *)0x0;
  pIStack_50 = (Instr *)pInlineeData;
  explicitThisArgOut = (Instr *)callFuncInfo;
  bVar3 = TryGetCallApplyAndTargetLdInstrs(this,callInstr,&local_a8,&callLdInstr);
  if (!bVar3) {
    return false;
  }
  callTargetLdInstr = (Instr *)0x0;
  local_54 = 0xffffffff;
  inlineeData = (FunctionJITTimeInfo *)0x0;
  local_34 = None;
  local_68 = (ulong)isCallInstanceFunction;
  callbackDefInstr = local_a8;
  local_70 = callLdInstr;
  local_60 = symCallerThis;
  bVar3 = TryGetCallApplyInlineeData
                    (this,inlinerData,callInstr,local_a8,callLdInstr,
                     (FunctionJITTimeInfo **)&callTargetLdInstr,&local_54,(Instr **)&inlineeData,
                     isCallInstanceFunction,&local_34);
  pIVar6 = callTargetLdInstr;
  if (!bVar3) {
    return false;
  }
  bVar3 = SkipCallApplyScriptTargetInlining_Shared
                    (this,callInstr,inlinerData,(FunctionJITTimeInfo *)callTargetLdInstr,false,true)
  ;
  pFVar2 = inlineeData;
  if (bVar3) {
    *(Instr **)pIStack_50 = pIVar6;
    return false;
  }
  bVar3 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)pIVar6);
  if (!bVar3) {
    if (pFVar2 != (FunctionJITTimeInfo *)0x0) {
      return false;
    }
    ValueType::ValueType((ValueType *)&local_32[0].field_0);
    InliningDecider::GetBuiltInInfo
              ((FunctionJITTimeInfo *)pIVar6,(OpCode *)&local_48,(ValueType *)&local_32[0].field_0);
    localFuncId = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pIVar6);
    builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
    if ((byte)(builtInId._value - 0x3c) < 3) {
      return false;
    }
    bVar3 = CanInlineBuiltInFunction
                      (this,callInstr,inlineeData_00,(OpCode)local_48,inlinerData,builtInId,true);
    if (!bVar3) {
      return false;
    }
    bVar3 = InlineCallBuiltInTarget
                      (this,callInstr,inlinerData,(FunctionJITTimeInfo *)pIVar6,
                       (FunctionJITTimeInfo *)explicitThisArgOut,local_70,(OpCode)local_48,local_60,
                       recursiveInlineDepth,SUB81(local_68,0),returnInstr);
    return bVar3;
  }
  local_80 = (Instr *)pFVar2;
  local_78 = IR::Opnd::GetStackSym(callInstr->m_src1);
  local_33 = callInstr->m_src1->field_0xb;
  local_32[0].bits._0_1_ = '\0';
  pIStack_50 = pIVar6;
  pIVar6 = TryGetFixedMethodsForBuiltInAndTarget
                     (this,callInstr,inlinerData,(FunctionJITTimeInfo *)pIVar6,
                      (FunctionJITTimeInfo *)explicitThisArgOut,callbackDefInstr,local_70,
                      (bool *)local_32,false,pFVar2 != (FunctionJITTimeInfo *)0x0);
  bVar3 = pIVar6 != (Instr *)0x0;
  if (pIVar6 == (Instr *)0x0) {
    return bVar3;
  }
  local_48 = (Instr *)0x0;
  AdjustArgoutsForCallTargetInlining(this,callInstr,&local_48,SUB81(local_68,0));
  if (local_48 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd5d,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar4) goto LAB_0055b4f2;
    *puVar7 = 0;
  }
  if ((undefined1)local_32[0].bits == '\x01') {
    pIVar8 = IR::Instr::GetBytecodeArgOutCapture(local_48);
    OVar5 = IR::Opnd::GetKind(pIVar8->m_src1);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      explicitThisArgOut = (Instr *)this;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xd62,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                         "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
      if (!bVar4) {
LAB_0055b4f2:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      this = (Inline *)explicitThisArgOut;
    }
    this_00 = IR::Opnd::AsRegOpnd(pIVar8->m_src1);
    pSVar9 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    if (pSVar9 != local_60) {
      local_32[0].bits._0_1_ = false;
    }
  }
  pIVar6 = InlineCallApplyTarget_Shared
                     (this,callInstr,(bool)((local_33 & 8) >> 3),local_78,
                      (FunctionJITTimeInfo *)pIStack_50,local_54,(bool)local_32[0]._0_1_,false,
                      local_34,local_80,recursiveInlineDepth,pIVar6);
  *returnInstr = pIVar6;
  return bVar3;
}

Assistant:

bool
Inline::InlineCallTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *callFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* callLdInstr = nullptr;
    IR::Instr* callTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &callLdInstr, &callTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, callLdInstr, callTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, isCallInstanceFunction, &targetType))
    {
        return false;
    }

    if (SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ false, /*isCallTarget*/ true))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    if (!inlineeData->HasBody())
    {
        if (targetIsCallback)
        {
            return false;
        }

        Js::OpCode builtInInlineOpCode;
        ValueType returnType;
        InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineOpCode, &returnType);
        Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
        switch (builtInId)
        {
        default:
        {
            if (CanInlineBuiltInFunction(callInstr, inlineeData, builtInInlineOpCode, inlinerData, builtInId, true))
            {
                return InlineCallBuiltInTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callTargetLdInstr, builtInInlineOpCode, symCallerThis, recursiveInlineDepth, isCallInstanceFunction, returnInstr);
            }
        }
        case Js::BuiltinFunction::JavascriptFunction_Apply:
        case Js::BuiltinFunction::JavascriptFunction_Call:
        case Js::BuiltinFunction::EngineInterfaceObject_CallInstanceFunction:
            return false;
        }
    }

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    IR::Instr * funcObjCheckInsertInstr = TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callLdInstr, callTargetLdInstr, safeThis, /*isApplyTarget*/ false, targetIsCallback);
    if (!funcObjCheckInsertInstr)
    {
        return false;
    }

    IR::Instr * explicitThisArgOut = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &explicitThisArgOut, isCallInstanceFunction);
    Assert(explicitThisArgOut);

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
        safeThis, /*isApplyTarget*/ false, targetType, callbackDefInstr, recursiveInlineDepth, funcObjCheckInsertInstr);

    return true;
}